

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  ulong uVar1;
  char_t *pcVar2;
  ulong uVar3;
  xml_attribute_struct *pxVar4;
  xml_node_struct *pxVar5;
  xml_attribute_struct *ptr;
  xml_node_struct *n_00;
  size_t sVar6;
  
  uVar1 = n->header;
  if ((uVar1 & 0x10) != 0) {
    pcVar2 = n->name;
    sVar6 = (size_t)*(ushort *)(pcVar2 + -2);
    if (sVar6 == 0) {
      sVar6 = *(size_t *)(pcVar2 + (-0x14 - (ulong)*(ushort *)(pcVar2 + -4)));
    }
    xml_allocator::deallocate_memory
              (alloc,pcVar2 + -4,sVar6,
               (xml_memory_page *)(pcVar2 + (-0x34 - (ulong)*(ushort *)(pcVar2 + -4))));
  }
  if ((uVar1 & 8) != 0) {
    pcVar2 = n->value;
    sVar6 = (size_t)*(ushort *)(pcVar2 + -2);
    if (sVar6 == 0) {
      sVar6 = *(size_t *)(pcVar2 + (-0x14 - (ulong)*(ushort *)(pcVar2 + -4)));
    }
    xml_allocator::deallocate_memory
              (alloc,pcVar2 + -4,sVar6,
               (xml_memory_page *)(pcVar2 + (-0x34 - (ulong)*(ushort *)(pcVar2 + -4))));
  }
  ptr = n->first_attribute;
  while (ptr != (xml_attribute_struct *)0x0) {
    uVar3 = ptr->header;
    pxVar4 = ptr->next_attribute;
    if ((uVar3 & 0x10) != 0) {
      pcVar2 = ptr->name;
      sVar6 = (size_t)*(ushort *)(pcVar2 + -2);
      if (sVar6 == 0) {
        sVar6 = *(size_t *)(pcVar2 + (-0x14 - (ulong)*(ushort *)(pcVar2 + -4)));
      }
      xml_allocator::deallocate_memory
                (alloc,pcVar2 + -4,sVar6,
                 (xml_memory_page *)(pcVar2 + (-0x34 - (ulong)*(ushort *)(pcVar2 + -4))));
    }
    if ((uVar3 & 8) != 0) {
      pcVar2 = ptr->value;
      sVar6 = (size_t)*(ushort *)(pcVar2 + -2);
      if (sVar6 == 0) {
        sVar6 = *(size_t *)(pcVar2 + (-0x14 - (ulong)*(ushort *)(pcVar2 + -4)));
      }
      xml_allocator::deallocate_memory
                (alloc,pcVar2 + -4,sVar6,
                 (xml_memory_page *)(pcVar2 + (-0x34 - (ulong)*(ushort *)(pcVar2 + -4))));
    }
    xml_allocator::deallocate_memory(alloc,ptr,0x28,(xml_memory_page *)(uVar3 & 0xffffffffffffffe0))
    ;
    ptr = pxVar4;
  }
  n_00 = n->first_child;
  while (n_00 != (xml_node_struct *)0x0) {
    pxVar5 = n_00->next_sibling;
    destroy_node(n_00,alloc);
    n_00 = pxVar5;
  }
  xml_allocator::deallocate_memory(alloc,n,0x40,(xml_memory_page *)(uVar1 & 0xffffffffffffffe0));
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		uintptr_t header = n->header;

		if (header & impl::xml_memory_page_name_allocated_mask) alloc.deallocate_string(n->name);
		if (header & impl::xml_memory_page_value_allocated_mask) alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), reinterpret_cast<xml_memory_page*>(header & xml_memory_page_pointer_mask));
	}